

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

ssize_t __thiscall
perfetto::base::UnixSocketRaw::Send
          (UnixSocketRaw *this,void *msg,size_t len,int *send_fds,size_t num_fds)

{
  int iVar1;
  ssize_t sVar2;
  ulong uVar3;
  int *piVar4;
  cmsghdr *__cmsg;
  char *fname;
  undefined4 extraout_var;
  ulong extraout_RDX;
  ulong *puVar5;
  cmsghdr *pcVar6;
  undefined1 *__dest;
  msghdr *pmVar7;
  UnixSocketRaw *pUVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  msghdr msg_hdr;
  iovec iov;
  char control_buf [256];
  ulong uStack_308;
  ulong uStack_300;
  undefined8 uStack_2f8;
  msghdr mStack_2f0;
  iovec iStack_2b8;
  cmsghdr acStack_2a8 [16];
  UnixSocketRaw *pUStack_1a8;
  msghdr local_178;
  iovec local_140;
  ulong local_130 [2];
  undefined1 local_120 [240];
  
  local_178.msg_control = (ulong *)0x0;
  local_178.msg_controllen = 0;
  local_178.msg_name = (void *)0x0;
  local_178.msg_namelen = 0;
  local_178._12_4_ = 0;
  local_178.msg_flags = 0;
  local_178._52_4_ = 0;
  local_178.msg_iov = &local_140;
  local_178.msg_iovlen = 1;
  local_140.iov_base = msg;
  local_140.iov_len = len;
  if (num_fds == 0) {
LAB_002ee262:
    sVar2 = SendMsgAllPosix(this,&local_178);
    return sVar2;
  }
  iVar1 = (int)(num_fds << 2);
  uVar10 = iVar1 + 0x17U & 0xfffffff8;
  uVar3 = (ulong)uVar10;
  if (uVar10 < 0x101) {
    memset(local_130,0,0x100);
    puVar5 = (ulong *)0x0;
    if (0xf < uVar3) {
      puVar5 = local_130;
    }
    puVar5[1] = 0x100000001;
    *puVar5 = (ulong)(iVar1 + 0x10);
    __dest = (undefined1 *)0x10;
    if (0xf < uVar3) {
      __dest = local_120;
    }
    local_178.msg_control = local_130;
    local_178.msg_controllen = uVar3;
    memcpy(__dest,send_fds,num_fds << 2);
    goto LAB_002ee262;
  }
  pmVar7 = (msghdr *)this;
  Send();
  mStack_2f0.msg_control = (cmsghdr *)0x0;
  mStack_2f0.msg_controllen = 0;
  mStack_2f0.msg_name = (void *)0x0;
  mStack_2f0.msg_namelen = 0;
  mStack_2f0._12_4_ = 0;
  mStack_2f0._48_8_ = 0;
  mStack_2f0.msg_iov = &iStack_2b8;
  mStack_2f0.msg_iovlen = 1;
  iStack_2b8.iov_base = msg;
  pUStack_1a8 = this;
  if (num_fds != 0) {
    mStack_2f0.msg_control = acStack_2a8;
    uVar10 = (int)num_fds * 4 + 0x17U & 0xfffffff8;
    mStack_2f0.msg_controllen = (size_t)uVar10;
    if (0x100 < uVar10) {
LAB_002ee465:
      uVar10 = (uint)msg;
      uStack_2f8 = 0x2ee46a;
      Receive();
      goto LAB_002ee46a;
    }
  }
  do {
    uVar10 = (((UnixSocketRaw *)pmVar7)->fd_).t_;
    pUVar8 = (UnixSocketRaw *)(ulong)uVar10;
    uStack_2f8 = 0x2ee30c;
    msg = &mStack_2f0;
    uVar3 = recvmsg(uVar10,&mStack_2f0,0);
    if (uVar3 != 0xffffffffffffffff) break;
    uStack_2f8 = 0x2ee31a;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  pmVar7 = (msghdr *)pUVar8;
  uVar10 = (uint)msg;
  if (0 < (long)uVar3) {
    if (extraout_RDX < uVar3) {
LAB_002ee46a:
      uStack_2f8 = 0x2ee46f;
      Receive();
      ((UnixSocketRaw *)pmVar7)->tx_timeout_ms_ = uVar10;
      uStack_308 = (ulong)uVar10 / 1000;
      uStack_300 = (ulong)((uVar10 % 1000) * 1000);
      iVar1 = setsockopt((((UnixSocketRaw *)pmVar7)->fd_).t_,1,0x15,&uStack_308,0x10);
      return CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),iVar1 == 0);
    }
    if (num_fds == 0) {
      pcVar6 = (cmsghdr *)0x0;
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      pcVar6 = (cmsghdr *)0x0;
      if ((cmsghdr *)mStack_2f0.msg_control != (cmsghdr *)0x0 && 0xf < mStack_2f0.msg_controllen) {
        pcVar6 = (cmsghdr *)0x0;
        __cmsg = (cmsghdr *)mStack_2f0.msg_control;
        do {
          if ((__cmsg->cmsg_level == 1) && (__cmsg->cmsg_type == 1)) {
            if (pcVar6 != (cmsghdr *)0x0) {
              uStack_2f8 = 0x2ee465;
              Receive();
              goto LAB_002ee465;
            }
            pcVar6 = __cmsg + 1;
            uVar11 = __cmsg->cmsg_len + 0x3fffffff0 >> 2;
          }
          uStack_2f8 = 0x2ee393;
          msg = __cmsg;
          pmVar7 = &mStack_2f0;
          __cmsg = __cmsg_nxthdr(&mStack_2f0,__cmsg);
        } while (__cmsg != (cmsghdr *)0x0);
        uVar11 = uVar11 & 0xffffffff;
      }
    }
    if ((mStack_2f0._48_8_ & 0x28) == 0) {
      if (uVar11 != 0 && pcVar6 != (cmsghdr *)0x0) {
        uVar9 = 0;
        do {
          if (uVar9 < num_fds) {
            uStack_2f8 = 0x2ee42e;
            ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
            ::reset((ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
                     *)send_fds,*(int *)((long)&pcVar6->cmsg_len + uVar9 * 4));
          }
          else {
            uStack_2f8 = 0x2ee43a;
            close(*(int *)((long)&pcVar6->cmsg_len + uVar9 * 4));
          }
          if (pcVar6 == (cmsghdr *)0x0) {
            return uVar3;
          }
          uVar9 = uVar9 + 1;
          send_fds = &((ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
                        *)send_fds)[1].t_;
        } while (uVar9 < uVar11);
      }
    }
    else {
      if (uVar11 != 0 && pcVar6 != (cmsghdr *)0x0) {
        uVar3 = 1;
        do {
          uStack_2f8 = 0x2ee3c9;
          close(*(int *)((long)pcVar6 + uVar3 * 4 + -4));
          if (pcVar6 == (cmsghdr *)0x0) break;
          bVar12 = uVar3 < uVar11;
          uVar3 = uVar3 + 1;
        } while (bVar12);
      }
      uStack_2f8 = 0x2ee3e6;
      fname = Basename(
                      "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                      );
      uStack_2f8 = 0x2ee401;
      LogMessage(kLogError,fname,0x10873,
                 "Socket message truncated. This might be due to a SELinux denial on fd:use.");
      uStack_2f8 = 0x2ee406;
      piVar4 = __errno_location();
      *piVar4 = 0x5a;
      uVar3 = 0xffffffffffffffff;
    }
  }
  return uVar3;
}

Assistant:

ssize_t UnixSocketRaw::Send(const void* msg,
                            size_t len,
                            const int* send_fds,
                            size_t num_fds) {
  PERFETTO_DCHECK(fd_);
  msghdr msg_hdr = {};
  iovec iov = {const_cast<void*>(msg), len};
  msg_hdr.msg_iov = &iov;
  msg_hdr.msg_iovlen = 1;
  alignas(cmsghdr) char control_buf[256];

  if (num_fds > 0) {
    const auto raw_ctl_data_sz = num_fds * sizeof(int);
    const CBufLenType control_buf_len =
        static_cast<CBufLenType>(CMSG_SPACE(raw_ctl_data_sz));
    PERFETTO_CHECK(control_buf_len <= sizeof(control_buf));
    memset(control_buf, 0, sizeof(control_buf));
    msg_hdr.msg_control = control_buf;
    msg_hdr.msg_controllen = control_buf_len;  // used by CMSG_FIRSTHDR
    struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg_hdr);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = static_cast<CBufLenType>(CMSG_LEN(raw_ctl_data_sz));
    memcpy(CMSG_DATA(cmsg), send_fds, num_fds * sizeof(int));
    // note: if we were to send multiple cmsghdr structures, then
    // msg_hdr.msg_controllen would need to be adjusted, see "man 3 cmsg".
  }

  return SendMsgAllPosix(&msg_hdr);
}